

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_hishelf2_get_heap_size(ma_hishelf2_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_result mVar1;
  ulong uVar2;
  double dVar3;
  double __x;
  
  if (pConfig != (ma_hishelf2_config *)0x0) {
    dVar3 = (pConfig->frequency * 6.283185307179586) / (double)pConfig->sampleRate;
    sin(dVar3);
    sin(1.5707963267948966 - dVar3);
    dVar3 = pow(10.0,pConfig->gainDB / 40.0);
    __x = (1.0 / pConfig->shelfSlope + -1.0) * (1.0 / dVar3 + dVar3) + 2.0;
    if (__x < 0.0) {
      sqrt(__x);
    }
    if (dVar3 < 0.0) {
      sqrt(dVar3);
    }
    if (pHeapSizeInBytes == (size_t *)0x0) {
      mVar1 = MA_INVALID_ARGS;
    }
    else {
      uVar2 = (ulong)pConfig->channels;
      *pHeapSizeInBytes = 0;
      if (uVar2 == 0) {
        mVar1 = (uint)(uVar2 != 0) * 2 + MA_INVALID_ARGS;
      }
      else {
        *pHeapSizeInBytes = uVar2 << 3;
        mVar1 = MA_SUCCESS;
      }
    }
    return mVar1;
  }
  __assert_fail("pConfig != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/miniaudio.h"
                ,0xbc75,
                "ma_biquad_config ma_hishelf2__get_biquad_config(const ma_hishelf2_config *)");
}

Assistant:

static MA_INLINE ma_biquad_config ma_hishelf2__get_biquad_config(const ma_hishelf2_config* pConfig)
{
    ma_biquad_config bqConfig;
    double w;
    double s;
    double c;
    double A;
    double S;
    double a;
    double sqrtA;

    MA_ASSERT(pConfig != NULL);

    w = 2 * MA_PI_D * pConfig->frequency / pConfig->sampleRate;
    s = ma_sind(w);
    c = ma_cosd(w);
    A = ma_powd(10, (pConfig->gainDB / 40));
    S = pConfig->shelfSlope;
    a = s/2 * ma_sqrtd((A + 1/A) * (1/S - 1) + 2);
    sqrtA = 2*ma_sqrtd(A)*a;

    bqConfig.b0 =  A * ((A + 1) + (A - 1)*c + sqrtA);
    bqConfig.b1 = -2 * A * ((A - 1) + (A + 1)*c);
    bqConfig.b2 =  A * ((A + 1) + (A - 1)*c - sqrtA);
    bqConfig.a0 =  (A + 1) - (A - 1)*c + sqrtA;
    bqConfig.a1 =  2 * ((A - 1) - (A + 1)*c);
    bqConfig.a2 =  (A + 1) - (A - 1)*c - sqrtA;

    bqConfig.format   = pConfig->format;
    bqConfig.channels = pConfig->channels;

    return bqConfig;
}